

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

bool jessilib::equals<char16_t,char8_t>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  jessilib *this;
  char16_t *pcVar2;
  char8_t *pcVar3;
  jessilib *this_00;
  decode_result dVar4;
  decode_result dVar5;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  jessilib *pjVar1;
  
  pcVar2 = lhs._M_str;
  this_00 = (jessilib *)lhs._M_len;
  pcVar3 = rhs._M_str;
  pjVar1 = (jessilib *)rhs._M_len;
  this = pjVar1;
  while( true ) {
    if ((this_00 == (jessilib *)0x0) || (this == (jessilib *)0x0)) {
      return this_00 == (jessilib *)0x0 && this == (jessilib *)0x0;
    }
    in_string._M_str = (char16_t *)pjVar1;
    in_string._M_len = (size_t)pcVar2;
    dVar4 = decode_codepoint_utf16<char16_t>(this_00,in_string);
    in_string_00._M_str = (char8_t *)dVar4.units;
    in_string_00._M_len = (size_t)pcVar3;
    dVar5 = decode_codepoint_utf8<char8_t>(this,in_string_00);
    pjVar1 = (jessilib *)dVar5.units;
    if (in_string_00._M_str == (char8_t *)0x0) {
      return false;
    }
    if (pjVar1 == (jessilib *)0x0) break;
    if (dVar4.codepoint != dVar5.codepoint) {
      return false;
    }
    pcVar2 = pcVar2 + (long)in_string_00._M_str;
    this_00 = this_00 + -(long)in_string_00._M_str;
    pcVar3 = pcVar3 + (long)pjVar1;
    this = this + -(long)pjVar1;
  }
  return false;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}